

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::PropertiesView::dump(PropertiesView *this,FastString *out,int indent)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  PropertyType PVar4;
  char *pcVar5;
  String local_a0;
  undefined1 local_8c [8];
  VisitorVariant visitor;
  String local_30;
  int local_1c;
  FastString *pFStack_18;
  int indent_local;
  FastString *out_local;
  PropertiesView *this_local;
  
  local_1c = indent;
  pFStack_18 = out;
  out_local = (FastString *)this;
  MQTTStringPrintf((char *)&local_30,"%*sProperties with length ",(ulong)(uint)indent,"");
  Bstrlib::String::operator+=(pFStack_18,&local_30);
  Bstrlib::String::~String(&local_30);
  Common::VBInt::dump(&this->length,pFStack_18,0);
  uVar2 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
  if (uVar2 != 0) {
    VisitorVariant::VisitorVariant((VisitorVariant *)local_8c);
    while (bVar1 = getProperty(this,(VisitorVariant *)local_8c), bVar1) {
      uVar3 = local_1c + 2;
      PVar4 = VisitorVariant::propertyType((VisitorVariant *)local_8c);
      pcVar5 = PrivateRegistry::getPropertyName((uint8)PVar4);
      MQTTStringPrintf((char *)&local_a0,"%*sType %s\n",(ulong)uVar3,"",pcVar5);
      Bstrlib::String::operator+=(pFStack_18,&local_a0);
      Bstrlib::String::~String(&local_a0);
      VisitorVariant::dump((VisitorVariant *)local_8c,pFStack_18,local_1c + 4);
    }
    VisitorVariant::~VisitorVariant((VisitorVariant *)local_8c);
  }
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sProperties with length ", (int)indent, ""); length.dump(out, 0);
                    if (!(uint32)length) return;
                    VisitorVariant visitor;
                    while (getProperty(visitor))
                    {
                        out += MQTTStringPrintf("%*sType %s\n", indent+2, "", PrivateRegistry::getPropertyName(visitor.propertyType()));
                        visitor.dump(out, indent + 4);
                    }
                }